

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
          (TiledRgbaInputFile *this,char *name,string *layerName,int numThreads)

{
  RgbaChannels RVar1;
  void *pvVar2;
  undefined4 in_ECX;
  undefined8 *in_RDI;
  int in_stack_000001d4;
  char *in_stack_000001d8;
  TiledInputFile *in_stack_000001e0;
  TiledRgbaInputFile *this_00;
  Header *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__TiledRgbaInputFile_004c1570;
  pvVar2 = operator_new(0x10);
  TiledInputFile::TiledInputFile(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
  in_RDI[1] = pvVar2;
  in_RDI[2] = 0;
  this_00 = (TiledRgbaInputFile *)(in_RDI + 3);
  TiledInputFile::header((TiledInputFile *)in_RDI[1]);
  anon_unknown_22::prefixFromLayerName(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  RVar1 = channels(this_00);
  if ((RVar1 & WRITE_Y) != 0) {
    pvVar2 = operator_new(0x50);
    FromYa::FromYa((FromYa *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                   (TiledInputFile *)in_stack_ffffffffffffffd8);
    in_RDI[2] = pvVar2;
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    const char name[], const string& layerName, int numThreads)
    : _inputFile (new TiledInputFile (name, numThreads))
    , _fromYa (0)
    , _channelNamePrefix (
          prefixFromLayerName (layerName, _inputFile->header ()))
{
    if (channels () & WRITE_Y) _fromYa = new FromYa (*_inputFile);
}